

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
exr_write_tile_chunk
          (exr_context_t ctxt,int part_index,int tilex,int tiley,int levelx,int levely,
          void *packed_data,uint64_t packed_size)

{
  int in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  exr_priv_part_t in_stack_00000010;
  int in_stack_0000001c;
  exr_context_t in_stack_00000020;
  exr_priv_part_t part;
  exr_result_t rv;
  uint64_t in_stack_00000058;
  void *in_stack_00000060;
  uint64_t in_stack_00000068;
  exr_const_context_t in_stack_ffffffffffffffa0;
  exr_const_context_t c;
  exr_result_t local_c;
  
  if (in_RDI == 0) {
    local_c = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffa0);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffffa0);
      local_c = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else if (*(int *)(*(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8) + 4) == 3) {
      internal_exr_unlock(in_stack_ffffffffffffffa0);
      local_c = (**(code **)(in_RDI + 0x38))(in_RDI,0x1c);
    }
    else {
      c = (exr_const_context_t)CONCAT44(in_stack_0000000c,in_stack_00000008);
      local_c = write_tile_chunk(in_stack_00000020,in_stack_0000001c,in_stack_00000010,
                                 in_stack_0000000c,in_stack_00000008,unaff_retaddr,levelx,
                                 (void *)CONCAT44(part_index,tilex),(uint64_t)ctxt,in_stack_00000058
                                 ,in_stack_00000060,in_stack_00000068);
      internal_exr_unlock(c);
    }
  }
  return local_c;
}

Assistant:

exr_result_t
exr_write_tile_chunk (
    exr_context_t ctxt,
    int           part_index,
    int           tilex,
    int           tiley,
    int           levelx,
    int           levely,
    const void*   packed_data,
    uint64_t      packed_size)
{
    exr_result_t rv;
    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (part->storage_mode == EXR_STORAGE_DEEP_TILED)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_USE_TILE_DEEP_WRITE));

    rv = write_tile_chunk (
        ctxt,
        part_index,
        part,
        tilex,
        tiley,
        levelx,
        levely,
        packed_data,
        packed_size,
        0,
        NULL,
        0);
    return EXR_UNLOCK_AND_RETURN (rv);
}